

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::AddCustomCommandToTarget
          (cmMakefile *this,string *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *byproducts,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,cmCustomCommandLines *commandLines,CustomCommandType type,char *comment,
          char *workingDir,bool escapeOldStyle,bool uses_terminal,string *depfile,
          bool command_expand_lists,ObjectLibraryCommands objLibraryCommands)

{
  bool bVar1;
  PolicyStatus PVar2;
  TargetType TVar3;
  pointer ppVar4;
  ostream *poVar5;
  reference sourceName;
  cmSourceFile *this_00;
  PolicyID id;
  undefined1 local_6b0 [8];
  cmCustomCommand cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_output;
  string local_590;
  cmSourceFile *local_570;
  cmSourceFile *out;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_560;
  const_iterator o;
  ostringstream local_538 [8];
  ostringstream e_2;
  string local_3c0;
  ostringstream local_3a0 [8];
  ostringstream e_1;
  string local_228;
  cmTarget *local_208;
  cmTarget *t;
  undefined1 local_1d0 [8];
  ostringstream e;
  MessageType local_54;
  bool issueMessage;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  _Stack_50;
  MessageType messageType;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_48;
  iterator ti;
  bool command_expand_lists_local;
  bool uses_terminal_local;
  bool escapeOldStyle_local;
  CustomCommandType type_local;
  cmCustomCommandLines *commandLines_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts_local;
  string *target_local;
  cmMakefile *this_local;
  
  ti.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  ._M_cur._3_1_ = escapeOldStyle;
  ti.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  ._M_cur._2_1_ = uses_terminal;
  ti.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  ._M_cur._1_1_ = command_expand_lists;
  ti.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  ._M_cur._4_4_ = type;
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
       ::find(&this->Targets,target);
  _Stack_50._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
       ::end(&this->Targets);
  bVar1 = std::__detail::operator==(&local_48,&stack0xffffffffffffffb0);
  if (bVar1) {
    local_54 = AUTHOR_WARNING;
    bVar1 = false;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
    PVar2 = GetPolicyStatus(this,CMP0040);
    if (PVar2 != OLD) {
      if (PVar2 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&t,(cmPolicies *)0x28,id);
        poVar5 = std::operator<<((ostream *)local_1d0,(string *)&t);
        std::operator<<(poVar5,"\n");
        std::__cxx11::string::~string((string *)&t);
        bVar1 = true;
      }
      else if (PVar2 - NEW < 3) {
        bVar1 = true;
        local_54 = FATAL_ERROR;
      }
    }
    if (bVar1) {
      local_208 = FindTargetToUse(this,target,false);
      if (local_208 == (cmTarget *)0x0) {
        poVar5 = std::operator<<((ostream *)local_1d0,"No TARGET \'");
        poVar5 = std::operator<<(poVar5,(string *)target);
        std::operator<<(poVar5,"\' has been created in this directory.");
      }
      else {
        bVar1 = cmTarget::IsImported(local_208);
        if (bVar1) {
          poVar5 = std::operator<<((ostream *)local_1d0,"TARGET \'");
          poVar5 = std::operator<<(poVar5,(string *)target);
          std::operator<<(poVar5,"\' is IMPORTED and does not build here.");
        }
        else {
          poVar5 = std::operator<<((ostream *)local_1d0,"TARGET \'");
          poVar5 = std::operator<<(poVar5,(string *)target);
          std::operator<<(poVar5,"\' was not created in this directory.");
        }
      }
      std::__cxx11::ostringstream::str();
      IssueMessage(this,local_54,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  }
  else {
    if (objLibraryCommands == RejectObjectLibraryCommands) {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                             *)&local_48);
      TVar3 = cmTarget::GetType(&ppVar4->second);
      if (TVar3 == OBJECT_LIBRARY) {
        std::__cxx11::ostringstream::ostringstream(local_3a0);
        poVar5 = std::operator<<((ostream *)local_3a0,"Target \"");
        poVar5 = std::operator<<(poVar5,(string *)target);
        std::operator<<(poVar5,
                        "\" is an OBJECT library that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands."
                       );
        std::__cxx11::ostringstream::str();
        IssueMessage(this,FATAL_ERROR,&local_3c0);
        std::__cxx11::string::~string((string *)&local_3c0);
        std::__cxx11::ostringstream::~ostringstream(local_3a0);
        return;
      }
    }
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                           *)&local_48);
    TVar3 = cmTarget::GetType(&ppVar4->second);
    if (TVar3 == INTERFACE_LIBRARY) {
      std::__cxx11::ostringstream::ostringstream(local_538);
      poVar5 = std::operator<<((ostream *)local_538,"Target \"");
      poVar5 = std::operator<<(poVar5,(string *)target);
      std::operator<<(poVar5,
                      "\" is an INTERFACE library that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands."
                     );
      std::__cxx11::ostringstream::str();
      IssueMessage(this,FATAL_ERROR,(string *)&o);
      std::__cxx11::string::~string((string *)&o);
      std::__cxx11::ostringstream::~ostringstream(local_538);
    }
    else {
      local_560._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(byproducts);
      while( true ) {
        out = (cmSourceFile *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(byproducts);
        bVar1 = __gnu_cxx::operator!=
                          (&local_560,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&out);
        if (!bVar1) break;
        sourceName = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_560);
        this_00 = GetOrCreateSource(this,sourceName,true);
        local_570 = this_00;
        if (this_00 != (cmSourceFile *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_590,"GENERATED",
                     (allocator *)
                     ((long)&no_output.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          cmSourceFile::SetProperty(this_00,&local_590,"1");
          std::__cxx11::string::~string((string *)&local_590);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&no_output.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_560);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cc.HaveComment);
      cmCustomCommand::cmCustomCommand
                ((cmCustomCommand *)local_6b0,this,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&cc.HaveComment,byproducts,depends,commandLines,comment,workingDir);
      cmCustomCommand::SetEscapeOldStyle
                ((cmCustomCommand *)local_6b0,
                 (bool)(ti.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                        ._M_cur._3_1_ & 1));
      cmCustomCommand::SetEscapeAllowMakeVars((cmCustomCommand *)local_6b0,true);
      cmCustomCommand::SetUsesTerminal
                ((cmCustomCommand *)local_6b0,
                 (bool)(ti.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                        ._M_cur._2_1_ & 1));
      cmCustomCommand::SetCommandExpandLists
                ((cmCustomCommand *)local_6b0,
                 (bool)(ti.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                        ._M_cur._1_1_ & 1));
      cmCustomCommand::SetDepfile((cmCustomCommand *)local_6b0,depfile);
      if (ti.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
          ._M_cur._4_4_ == PRE_BUILD) {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_48);
        cmTarget::AddPreBuildCommand(&ppVar4->second,(cmCustomCommand *)local_6b0);
      }
      else if (ti.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
               ._M_cur._4_4_ == PRE_LINK) {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_48);
        cmTarget::AddPreLinkCommand(&ppVar4->second,(cmCustomCommand *)local_6b0);
      }
      else if (ti.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
               ._M_cur._4_4_ == POST_BUILD) {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_48);
        cmTarget::AddPostBuildCommand(&ppVar4->second,(cmCustomCommand *)local_6b0);
      }
      cmCustomCommand::~cmCustomCommand((cmCustomCommand *)local_6b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cc.HaveComment);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddCustomCommandToTarget(
  const std::string& target, const std::vector<std::string>& byproducts,
  const std::vector<std::string>& depends,
  const cmCustomCommandLines& commandLines, cmTarget::CustomCommandType type,
  const char* comment, const char* workingDir, bool escapeOldStyle,
  bool uses_terminal, const std::string& depfile, bool command_expand_lists,
  ObjectLibraryCommands objLibraryCommands)
{
  // Find the target to which to add the custom command.
  cmTargets::iterator ti = this->Targets.find(target);

  if (ti == this->Targets.end()) {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    bool issueMessage = false;
    std::ostringstream e;
    switch (this->GetPolicyStatus(cmPolicies::CMP0040)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0040) << "\n";
        issueMessage = true;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
    }

    if (issueMessage) {
      if (cmTarget const* t = this->FindTargetToUse(target)) {
        if (t->IsImported()) {
          e << "TARGET '" << target
            << "' is IMPORTED and does not build here.";
        } else {
          e << "TARGET '" << target << "' was not created in this directory.";
        }
      } else {
        e << "No TARGET '" << target
          << "' has been created in this directory.";
      }
      IssueMessage(messageType, e.str());
    }

    return;
  }

  if (objLibraryCommands == RejectObjectLibraryCommands &&
      ti->second.GetType() == cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "Target \"" << target
      << "\" is an OBJECT library "
         "that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands.";
    this->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }
  if (ti->second.GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    std::ostringstream e;
    e << "Target \"" << target
      << "\" is an INTERFACE library "
         "that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands.";
    this->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }

  // Always create the byproduct sources and mark them generated.
  for (std::vector<std::string>::const_iterator o = byproducts.begin();
       o != byproducts.end(); ++o) {
    if (cmSourceFile* out = this->GetOrCreateSource(*o, true)) {
      out->SetProperty("GENERATED", "1");
    }
  }

  // Add the command to the appropriate build step for the target.
  std::vector<std::string> no_output;
  cmCustomCommand cc(this, no_output, byproducts, depends, commandLines,
                     comment, workingDir);
  cc.SetEscapeOldStyle(escapeOldStyle);
  cc.SetEscapeAllowMakeVars(true);
  cc.SetUsesTerminal(uses_terminal);
  cc.SetCommandExpandLists(command_expand_lists);
  cc.SetDepfile(depfile);
  switch (type) {
    case cmTarget::PRE_BUILD:
      ti->second.AddPreBuildCommand(cc);
      break;
    case cmTarget::PRE_LINK:
      ti->second.AddPreLinkCommand(cc);
      break;
    case cmTarget::POST_BUILD:
      ti->second.AddPostBuildCommand(cc);
      break;
  }
}